

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnRefIsNullExpr(TypeChecker *this)

{
  Result RVar1;
  Result RVar2;
  char *in_RCX;
  Type type;
  TypeVector actual;
  string local_68;
  string message;
  
  RVar1 = PeekType(this,0,&type);
  if ((8 < (uint)(type.enum_ + ~(Func|I32U))) ||
     (in_RCX = (char *)0x181, (0x181U >> (type.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (RVar1.enum_ == Ok) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&actual,&type);
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)&actual,(TypeVector *)0x0,in_RCX);
    std::operator+(&message,"type mismatch in ref.is_null, expected reference but got ",&local_68);
    std::__cxx11::string::_M_dispose();
    PrintError(this,"%s",message._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&actual);
    RVar1.enum_ = Error;
  }
  RVar2 = DropTypes(this,1);
  PushType(this,(Type)0xffffffff);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnRefIsNullExpr() {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsRef()) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in ref.is_null, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  result |= DropTypes(1);
  PushType(Type::I32);
  return result;
}